

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclShortNames(SC_Lib *p)

{
  SC_Cell *pSVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  int Count;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  SC_Cell *pCell;
  SC_Cell *pSVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  char Buffer [10000];
  uint local_278c;
  char local_2748 [10008];
  
  uVar6 = (p->vCellClasses).nSize;
  uVar14 = 0;
  if (0 < (int)uVar6) {
    uVar14 = uVar6;
  }
  if ((1 < (int)uVar6) && (uVar6 = uVar14 - 1, uVar14 = 0, uVar6 != 0)) {
    uVar14 = 0;
    do {
      uVar14 = uVar14 + 1;
      bVar5 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar5);
  }
  if (0 < (p->vCellClasses).nSize) {
    lVar15 = 0;
    do {
      pSVar1 = (SC_Cell *)(p->vCellClasses).pArray[lVar15];
      uVar6 = 0;
      pSVar10 = pSVar1;
      do {
        uVar6 = uVar6 + (pSVar10->fSkip == 0);
        pSVar10 = pSVar10->pNext;
      } while (pSVar10 != pSVar1);
      if (1 < uVar6) {
        uVar18 = uVar6 - 1;
        uVar6 = 0;
        if (uVar18 != 0) {
          do {
            uVar6 = uVar6 + 1;
            bVar5 = 9 < uVar18;
            uVar18 = uVar18 / 10;
          } while (bVar5);
        }
      }
      local_278c = 0;
      pSVar10 = pSVar1;
      do {
        if (pSVar10->pName != (char *)0x0) {
          free(pSVar10->pName);
          pSVar10->pName = (char *)0x0;
        }
        sprintf(local_2748,"g%0*d_%0*d",(ulong)uVar14,lVar15,(ulong)uVar6,(ulong)local_278c);
        sVar8 = strlen(local_2748);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,local_2748);
        pSVar10->pName = pcVar9;
        uVar18 = pSVar10->n_inputs;
        uVar11 = (ulong)uVar18;
        if ((int)uVar18 < (pSVar10->vPins).nSize) {
          do {
            if ((int)uVar18 < 0) goto LAB_003ef4c0;
            pvVar2 = (pSVar10->vPins).pArray[uVar11];
            if (0 < *(int *)((long)pvVar2 + 0x44)) {
              lVar16 = 0;
              do {
                puVar3 = *(undefined8 **)(*(long *)((long)pvVar2 + 0x48) + lVar16 * 8);
                if (0 < *(int *)((long)puVar3 + 0xc)) {
                  lVar13 = 0;
                  do {
                    if (0 < pSVar10->n_inputs) {
                      puVar4 = *(undefined8 **)(puVar3[2] + lVar13 * 8);
                      lVar19 = 0;
                      do {
                        if ((pSVar10->vPins).nSize <= lVar19) goto LAB_003ef4c0;
                        pcVar9 = (char *)*puVar4;
                        if ((pcVar9 != (char *)0x0) &&
                           (iVar7 = strcmp(pcVar9,*(pSVar10->vPins).pArray[lVar19]), iVar7 == 0)) {
                          free(pcVar9);
                          *puVar4 = 0;
                          local_2748[0] = (char)lVar19 + 'a';
                          local_2748[1] = 0;
                          sVar8 = strlen(local_2748);
                          pcVar9 = (char *)malloc(sVar8 + 1);
                          strcpy(pcVar9,local_2748);
                          *puVar4 = pcVar9;
                        }
                        lVar19 = lVar19 + 1;
                      } while (lVar19 < pSVar10->n_inputs);
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < *(int *)((long)puVar3 + 0xc));
                }
                if (0 < pSVar10->n_inputs) {
                  lVar13 = 0;
                  do {
                    if ((pSVar10->vPins).nSize <= lVar13) goto LAB_003ef4c0;
                    pcVar9 = (char *)*puVar3;
                    if ((pcVar9 != (char *)0x0) &&
                       (iVar7 = strcmp(pcVar9,*(pSVar10->vPins).pArray[lVar13]), iVar7 == 0)) {
                      free(pcVar9);
                      *puVar3 = 0;
                      local_2748[0] = (char)lVar13 + 'a';
                      local_2748[1] = 0;
                      sVar8 = strlen(local_2748);
                      pcVar9 = (char *)malloc(sVar8 + 1);
                      strcpy(pcVar9,local_2748);
                      *puVar3 = pcVar9;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < pSVar10->n_inputs);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < *(int *)((long)pvVar2 + 0x44));
            }
            Abc_SclShortFormula(pSVar10,*(char **)((long)pvVar2 + 0x28),local_2748);
            if (*(void **)((long)pvVar2 + 0x28) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 0x28));
              *(undefined8 *)((long)pvVar2 + 0x28) = 0;
            }
            sVar8 = strlen(local_2748);
            pcVar9 = (char *)malloc(sVar8 + 1);
            strcpy(pcVar9,local_2748);
            *(char **)((long)pvVar2 + 0x28) = pcVar9;
            uVar11 = uVar11 + 1;
          } while ((int)uVar11 < (pSVar10->vPins).nSize);
        }
        uVar11 = (ulong)(uint)pSVar10->n_inputs;
        if (0 < pSVar10->n_inputs) {
          lVar16 = 0;
          do {
            if ((pSVar10->vPins).nSize <= lVar16) goto LAB_003ef4c0;
            puVar3 = (undefined8 *)(pSVar10->vPins).pArray[lVar16];
            if ((void *)*puVar3 != (void *)0x0) {
              free((void *)*puVar3);
              *puVar3 = 0;
            }
            local_2748[0] = (char)lVar16 + 'a';
            local_2748[1] = 0;
            sVar8 = strlen(local_2748);
            pcVar9 = (char *)malloc(sVar8 + 1);
            strcpy(pcVar9,local_2748);
            *puVar3 = pcVar9;
            lVar16 = lVar16 + 1;
            uVar11 = (ulong)pSVar10->n_inputs;
          } while (lVar16 < (long)uVar11);
        }
        if ((int)uVar11 < (pSVar10->vPins).nSize) {
          uVar17 = uVar11 & 0xffffffff;
          cVar12 = 'z' - (char)uVar11;
          uVar20 = uVar11 & 0xffffffff;
          do {
            if ((int)uVar11 < 0) {
LAB_003ef4c0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar3 = (undefined8 *)(pSVar10->vPins).pArray[uVar17];
            if ((void *)*puVar3 != (void *)0x0) {
              free((void *)*puVar3);
              *puVar3 = 0;
            }
            local_2748[0] = (char)pSVar10->n_inputs + cVar12;
            local_2748[1] = 0;
            sVar8 = strlen(local_2748);
            pcVar9 = (char *)malloc(sVar8 + 1);
            strcpy(pcVar9,local_2748);
            *puVar3 = pcVar9;
            uVar17 = uVar17 + 1;
            cVar12 = cVar12 + -1;
            uVar18 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar18;
          } while ((int)uVar18 < (pSVar10->vPins).nSize);
        }
        pSVar10 = pSVar10->pNext;
        local_278c = local_278c + 1;
      } while (pSVar10 != pSVar1);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCellClasses).nSize);
  }
  p->nBins = 0;
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  Abc_SclHashCells(p);
  printf("Renaming library \"%s\" into \"%s%d\".\n",p->pName,"lib",(ulong)(uint)(p->vCells).nSize);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  sprintf(local_2748,"lib%d",(ulong)(uint)(p->vCells).nSize);
  sVar8 = strlen(local_2748);
  pcVar9 = (char *)malloc(sVar8 + 1);
  strcpy(pcVar9,local_2748);
  p->pName = pcVar9;
  return;
}

Assistant:

void Abc_SclShortNames( SC_Lib * p )
{
    char Buffer[10000];
    SC_Cell * pClass, * pCell; SC_Pin * pPin;
    int i, k, n, nClasses = Abc_SclLibClassNum(p);
    int nDigits = Abc_Base10Log( nClasses );
    // itereate through classes
    SC_LibForEachCellClass( p, pClass, i )
    {
        int nDigits2 = Abc_Base10Log( Abc_SclClassCellNum(pClass) );
        SC_RingForEachCell( pClass, pCell, k )
        {
            ABC_FREE( pCell->pName );
            sprintf( Buffer, "g%0*d_%0*d", nDigits, i, nDigits2, k );
            pCell->pName = Abc_UtilStrsav( Buffer );
            // formula
            SC_CellForEachPinOut( pCell, pPin, n )
                Abc_SclPinUpdate( pCell, pPin, Buffer );
            // pin names
            SC_CellForEachPinIn( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'a'+n );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
            SC_CellForEachPinOut( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'z'-n+pCell->n_inputs );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
        }
    }
    p->nBins = 0;
    ABC_FREE( p->pBins );
    Abc_SclHashCells( p );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", p->pName, "lib", SC_LibCellNum(p) );
    ABC_FREE( p->pName );
    sprintf( Buffer, "lib%d", SC_LibCellNum(p) );
    p->pName = Abc_UtilStrsav( Buffer );
}